

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

void Acb_NtkFindNodes2_rec(Acb_Ntk_t *p,int iObj,Vec_Int_t *vNodes)

{
  int iVar1;
  int *piVar2;
  int local_30;
  int i;
  int iFanin;
  int *pFanin;
  Vec_Int_t *vNodes_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjSetTravIdCur(p,iObj);
  if ((iVar1 == 0) && (iVar1 = Acb_ObjIsCi(p,iObj), iVar1 == 0)) {
    local_30 = 0;
    piVar2 = Acb_ObjFanins(p,iObj);
    for (; local_30 < *piVar2; local_30 = local_30 + 1) {
      Acb_NtkFindNodes2_rec(p,piVar2[local_30 + 1],vNodes);
    }
    iVar1 = Acb_ObjIsCo(p,iObj);
    if (iVar1 != 0) {
      __assert_fail("!Acb_ObjIsCo(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                    ,0x2ce,"void Acb_NtkFindNodes2_rec(Acb_Ntk_t *, int, Vec_Int_t *)");
    }
    Vec_IntPush(vNodes,iObj);
  }
  return;
}

Assistant:

void Acb_NtkFindNodes2_rec( Acb_Ntk_t * p, int iObj, Vec_Int_t * vNodes )
{
    int * pFanin, iFanin, i;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( Acb_ObjIsCi(p, iObj) )
        return;
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, i )
        Acb_NtkFindNodes2_rec( p, iFanin, vNodes );
    assert( !Acb_ObjIsCo(p, iObj) );
    Vec_IntPush( vNodes, iObj );
}